

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
quantileloss::getUnsafeUpdate(quantileloss *this,float prediction,float label,float update_scale)

{
  float fVar1;
  float err;
  float update_scale_local;
  float label_local;
  float prediction_local;
  quantileloss *this_local;
  float local_4;
  
  fVar1 = label - prediction;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (fVar1 <= 0.0) {
      local_4 = -(1.0 - this->tau) * update_scale;
    }
    else {
      local_4 = this->tau * update_scale;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float getUnsafeUpdate(float prediction, float label, float update_scale)
  {
    float err = label - prediction;
    if (err == 0)
      return 0;
    if (err > 0)
      return tau * update_scale;
    return -(1 - tau) * update_scale;
  }